

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImDrawChannel_resize(ImVector_ImDrawChannel *self,int new_size)

{
  ImDrawChannel *__dest;
  int iVar1;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar1 << 5);
    if (self->Data != (ImDrawChannel *)0x0) {
      memcpy(__dest,self->Data,(long)self->Size << 5);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar1;
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resize(ImVector_ImDrawChannel* self,int new_size)
{
    return self->resize(new_size);
}